

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAndRgEa<(moira::Instr)9,(moira::Mode)7,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 val;
  u32 data;
  u32 ea;
  u32 local_20;
  u32 local_1c;
  
  bVar1 = readOp<(moira::Mode)7,(moira::Size)2,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    val = logic<(moira::Instr)9,(moira::Size)2>
                    (this,(uint)*(ushort *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58)
                     ,local_20);
    prefetch<0ul>(this);
    writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,local_1c,val);
  }
  return;
}

Assistant:

void
Moira::execAndRgEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    u32 result = logic<I,S>(readD<S>(src), data);
    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(4);
    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}